

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form5_Histogram(HistogramForm5 Histogram)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  byte value;
  long lVar6;
  bool bVar7;
  ushort uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  uint uVar15;
  undefined1 auVar16 [64];
  Image mask;
  Image image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  ImageTemplate<unsigned_char> local_88;
  Image local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_88,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_60,value,0,0,&local_88);
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
  bVar7 = true;
  if (local_60._height < 2) goto LAB_00151242;
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (&local_88,&local_60,local_60._width,local_60._height,local_60._colorCount,'\x01');
  Unit_Test::fillImage(&local_88,0,0,local_88._width,local_88._height >> 1,0xff);
  Unit_Test::fillImage
            (&local_88,0,local_88._height >> 1,local_88._width,
             local_88._height - (local_88._height >> 1),'\0');
  (*Histogram)(&local_38,&local_60,&local_88);
  if ((long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0x400) {
    bVar7 = false;
    uVar15 = 0;
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[value] == (local_60._height >> 1) * local_60._width) {
      if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        lVar6 = 0;
        auVar12 = vpbroadcastq_avx512f();
        auVar12 = vpsrlq_avx512f(auVar12,2);
        do {
          auVar13 = vpbroadcastq_avx512f();
          auVar14 = vmovdqa64_avx512f(auVar16);
          auVar16 = vporq_avx512f(auVar13,auVar10);
          auVar13 = vporq_avx512f(auVar13,auVar11);
          uVar3 = vpcmpuq_avx512f(auVar13,auVar12,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar16,auVar12,2);
          bVar5 = (byte)uVar3;
          uVar8 = CONCAT11(bVar5,bVar4);
          auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       (local_38.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar6));
          auVar13._4_4_ = (uint)((byte)(uVar8 >> 1) & 1) * auVar16._4_4_;
          auVar13._0_4_ = (uint)(bVar4 & 1) * auVar16._0_4_;
          auVar13._8_4_ = (uint)((byte)(uVar8 >> 2) & 1) * auVar16._8_4_;
          auVar13._12_4_ = (uint)((byte)(uVar8 >> 3) & 1) * auVar16._12_4_;
          auVar13._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * auVar16._16_4_;
          auVar13._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * auVar16._20_4_;
          auVar13._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * auVar16._24_4_;
          auVar13._28_4_ = (uint)((byte)(uVar8 >> 7) & 1) * auVar16._28_4_;
          auVar13._32_4_ = (uint)(bVar5 & 1) * auVar16._32_4_;
          auVar13._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar16._36_4_;
          auVar13._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar16._40_4_;
          auVar13._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar16._44_4_;
          auVar13._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar16._48_4_;
          auVar13._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar16._52_4_;
          auVar13._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar16._56_4_;
          auVar13._60_4_ = (uint)(bVar5 >> 7) * auVar16._60_4_;
          lVar6 = lVar6 + 0x10;
          auVar16 = vpaddd_avx512f(auVar13,auVar14);
        } while (lVar6 != 0x100);
        auVar10 = vmovdqa32_avx512f(auVar16);
        auVar11._0_4_ = (uint)(bVar4 & 1) * auVar10._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar14._0_4_
        ;
        bVar7 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar11._4_4_ = (uint)bVar7 * auVar10._4_4_ | (uint)!bVar7 * auVar14._4_4_;
        bVar7 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar11._8_4_ = (uint)bVar7 * auVar10._8_4_ | (uint)!bVar7 * auVar14._8_4_;
        bVar7 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar11._12_4_ = (uint)bVar7 * auVar10._12_4_ | (uint)!bVar7 * auVar14._12_4_;
        bVar7 = (bool)((byte)(uVar8 >> 4) & 1);
        auVar11._16_4_ = (uint)bVar7 * auVar10._16_4_ | (uint)!bVar7 * auVar14._16_4_;
        bVar7 = (bool)((byte)(uVar8 >> 5) & 1);
        auVar11._20_4_ = (uint)bVar7 * auVar10._20_4_ | (uint)!bVar7 * auVar14._20_4_;
        bVar7 = (bool)((byte)(uVar8 >> 6) & 1);
        auVar11._24_4_ = (uint)bVar7 * auVar10._24_4_ | (uint)!bVar7 * auVar14._24_4_;
        bVar7 = (bool)((byte)(uVar8 >> 7) & 1);
        auVar11._28_4_ = (uint)bVar7 * auVar10._28_4_ | (uint)!bVar7 * auVar14._28_4_;
        auVar11._32_4_ =
             (uint)(bVar5 & 1) * auVar10._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar14._32_4_;
        bVar7 = (bool)(bVar5 >> 1 & 1);
        auVar11._36_4_ = (uint)bVar7 * auVar10._36_4_ | (uint)!bVar7 * auVar14._36_4_;
        bVar7 = (bool)(bVar5 >> 2 & 1);
        auVar11._40_4_ = (uint)bVar7 * auVar10._40_4_ | (uint)!bVar7 * auVar14._40_4_;
        bVar7 = (bool)(bVar5 >> 3 & 1);
        auVar11._44_4_ = (uint)bVar7 * auVar10._44_4_ | (uint)!bVar7 * auVar14._44_4_;
        bVar7 = (bool)(bVar5 >> 4 & 1);
        auVar11._48_4_ = (uint)bVar7 * auVar10._48_4_ | (uint)!bVar7 * auVar14._48_4_;
        bVar7 = (bool)(bVar5 >> 5 & 1);
        auVar11._52_4_ = (uint)bVar7 * auVar10._52_4_ | (uint)!bVar7 * auVar14._52_4_;
        bVar7 = (bool)(bVar5 >> 6 & 1);
        auVar11._56_4_ = (uint)bVar7 * auVar10._56_4_ | (uint)!bVar7 * auVar14._56_4_;
        auVar11._60_4_ =
             (uint)(bVar5 >> 7) * auVar10._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar14._60_4_;
        auVar9 = vextracti64x4_avx512f(auVar11,1);
        auVar10 = vpaddd_avx512f(auVar11,ZEXT3264(auVar9));
        auVar1 = vpaddd_avx(auVar10._0_16_,auVar10._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        auVar2 = vpshufd_avx(auVar1,0x55);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        uVar15 = auVar1._0_4_;
      }
      bVar7 = uVar15 == local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[value];
      goto LAB_00151227;
    }
LAB_0015122c:
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  else {
    bVar7 = false;
LAB_00151227:
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0015122c;
  }
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
LAB_00151242:
  local_60._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_60);
  return bVar7;
}

Assistant:

bool form5_Histogram(HistogramForm5 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        if ( image.height() / 2 == 0 )
            return true;

        PenguinV_Image::Image mask = image.generate( image.width(), image.height(), image.colorCount() );
        fillImage( mask, 0, 0, mask.width(), mask.height() / 2, 255 );
        fillImage( mask, 0, mask.height() / 2, mask.width(), mask.height() - mask.height() / 2, 0 );

        const std::vector < uint32_t > histogram = Histogram( image, mask );

        return histogram.size() == 256u && histogram[intensity] == image.width() * (image.height() / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * (image.height() / 2);
    }